

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

reentrant_put_transaction<Func> * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
::
start_reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
          (reentrant_put_transaction<Func> *__return_storage_ptr__,
          heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
          *this,Func_conflict *i_construction_params)

{
  char *pcVar1;
  reentrant_put_transaction<Func> local_30;
  
  local_30.m_put_data = inplace_allocate<1ul,true,16ul,8ul>(this);
  local_30.m_put_data.m_control_block[1].m_next =
       (uintptr_t)
       detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::Impl<Func>::
       align_invoke_destroy;
  pcVar1 = i_construction_params->m_string_2;
  *(char **)local_30.m_put_data.m_user_storage = i_construction_params->m_string_1;
  *(char **)((long)local_30.m_put_data.m_user_storage + 8) = pcVar1;
  __return_storage_ptr__->m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)this;
  __return_storage_ptr__->m_put_data = local_30.m_put_data;
  local_30.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_30);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              detail::Queue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  detail::Queue_Busy);
                push_data.m_control_block->m_next += detail::Queue_Dead - detail::Queue_Busy;
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }